

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict_manager.cpp
# Opt level: O2

void __thiscall
duckdb::ConflictManager::AddIndex
          (ConflictManager *this,BoundIndex *index,
          optional_ptr<duckdb::BoundIndex,_true> delete_index)

{
  reference_wrapper<duckdb::BoundIndex> local_28;
  value_type local_20;
  
  local_28._M_data = index;
  local_20.ptr = delete_index.ptr;
  ::std::
  vector<std::reference_wrapper<duckdb::BoundIndex>,std::allocator<std::reference_wrapper<duckdb::BoundIndex>>>
  ::emplace_back<std::reference_wrapper<duckdb::BoundIndex>>
            ((vector<std::reference_wrapper<duckdb::BoundIndex>,std::allocator<std::reference_wrapper<duckdb::BoundIndex>>>
              *)&this->matched_indexes,&local_28);
  ::std::
  vector<duckdb::optional_ptr<duckdb::BoundIndex,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,_true>_>_>
  ::push_back(&(this->matched_delete_indexes).
               super_vector<duckdb::optional_ptr<duckdb::BoundIndex,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,_true>_>_>
              ,&local_20);
  ::std::__detail::
  _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)&this->matched_index_names,&index->name);
  return;
}

Assistant:

void ConflictManager::AddIndex(BoundIndex &index, optional_ptr<BoundIndex> delete_index) {
	matched_indexes.push_back(index);
	matched_delete_indexes.push_back(delete_index);
	matched_index_names.insert(index.name);
}